

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VaultClient.h
# Opt level: O2

string * Vault::operator+(string *__return_storage_ptr__,string *string,
                         Tiny<Vault::SecretVersionDetail,_long> *tiny)

{
  string sStack_38;
  
  Tiny<Vault::SecretVersionDetail,long>::toString_abi_cxx11_(&sStack_38,tiny);
  std::operator+(__return_storage_ptr__,string,&sStack_38);
  std::__cxx11::string::~string((string *)&sStack_38);
  return __return_storage_ptr__;
}

Assistant:

std::string operator+(const std::string &string, const Tiny &tiny) {
    return string + tiny.toString();
  }